

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Segment::DoLoadCluster(Segment *this,longlong *pos,long *len)

{
  Cluster *this_00;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  Cues *pCVar4;
  long lVar5;
  Cluster *pCVar6;
  longlong lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong unaff_R13;
  long lVar11;
  longlong avail;
  longlong total;
  long len_;
  longlong pos_;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  longlong local_38;
  
  if (this->m_pos < 0) {
    lVar11 = DoLoadClusterUnknownSize(this,pos,len);
    return lVar11;
  }
  iVar2 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&local_58,&local_60);
  if (iVar2 < 0) {
    return (long)iVar2;
  }
  if ((-1 < local_58) && (local_58 < local_60)) {
    return -2;
  }
  lVar11 = this->m_start + this->m_size;
  local_70 = 0xffffffffffffffff;
  if (this->m_size < 0) {
    lVar11 = -1;
  }
  local_68 = -1;
  do {
    lVar5 = this->m_pos;
    if (-1 < local_58 && local_58 <= lVar5) {
      return 1;
    }
    if (-1 < lVar11 && lVar11 <= lVar5) {
      return 1;
    }
    *pos = lVar5;
    if (local_60 <= lVar5) {
      *len = 1;
      return -3;
    }
    uVar3 = GetUIntLength(this->m_pReader,lVar5,len);
    iVar2 = 1;
    if ((long)uVar3 < 0) goto LAB_00110dda;
    if (uVar3 == 0) {
      if ((lVar11 < 0) || (*len + *pos <= lVar11)) {
        lVar5 = *pos;
        if (local_60 < *len + lVar5) goto LAB_00110d55;
        lVar7 = ReadID(this->m_pReader,lVar5,len);
        if (lVar7 < 0) goto LAB_00110dce;
        lVar9 = *pos + *len;
        *pos = lVar9;
        if (local_60 <= lVar9) {
          *len = 1;
          goto LAB_00110d55;
        }
        uVar3 = GetUIntLength(this->m_pReader,lVar9,len);
        if ((long)uVar3 < 0) goto LAB_00110dda;
        if (uVar3 != 0) goto LAB_00110d55;
        if ((-1 < lVar11) && (lVar11 < *len + *pos)) goto LAB_00110dce;
        if (local_60 < *len + *pos) goto LAB_00110d55;
        uVar3 = ReadUInt(this->m_pReader,*pos,len);
        if (-1 < (long)uVar3) {
          lVar9 = *len;
          lVar10 = *pos + lVar9;
          *pos = lVar10;
          if (uVar3 != 0) {
            uVar8 = -1L << ((char)lVar9 * '\a' & 0x3fU) ^ uVar3;
            lVar9 = lVar10 + uVar3;
            if (((lVar11 < 0) || (uVar8 == 0xffffffffffffffff)) || (lVar9 <= lVar11)) {
              if (lVar7 == 0x1f43b675) {
                local_68 = lVar5 - this->m_start;
                if (uVar8 != 0xffffffffffffffff) {
                  local_70 = uVar3;
                }
                iVar2 = 2;
                uVar3 = unaff_R13;
                goto LAB_00110dda;
              }
              if (lVar7 == 0x1c53bb6b) {
                if (uVar8 != 0xffffffffffffffff) {
                  local_48 = lVar10;
                  if (this->m_pCues == (Cues *)0x0) {
                    local_50 = lVar9;
                    pCVar4 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
                    if (pCVar4 == (Cues *)0x0) {
                      pCVar4 = (Cues *)0x0;
                    }
                    else {
                      pCVar4->m_pSegment = this;
                      pCVar4->m_start = local_48;
                      pCVar4->m_size = uVar3;
                      pCVar4->m_element_start = lVar5;
                      pCVar4->m_element_size = (uVar3 - lVar5) + local_48;
                      pCVar4->m_cue_points = (CuePoint **)0x0;
                      pCVar4->m_count = 0;
                      pCVar4->m_preload_count = 0;
                      pCVar4->m_pos = local_48;
                    }
                    this->m_pCues = pCVar4;
                    unaff_R13 = -(ulong)(pCVar4 == (Cues *)0x0) | unaff_R13;
                    lVar9 = local_50;
                    uVar3 = unaff_R13;
                    if (pCVar4 == (Cues *)0x0) goto LAB_00110dda;
                  }
                  this->m_pos = lVar9;
                  iVar2 = 3;
                  uVar3 = unaff_R13;
                  goto LAB_00110dda;
                }
              }
              else if (uVar8 != 0xffffffffffffffff) {
                this->m_pos = lVar9;
                goto LAB_00110ea6;
              }
            }
            goto LAB_00110dce;
          }
          this->m_pos = lVar10;
LAB_00110ea6:
          iVar2 = 3;
          uVar3 = unaff_R13;
        }
      }
      else {
LAB_00110dce:
        uVar3 = 0xfffffffffffffffe;
      }
    }
    else {
LAB_00110d55:
      uVar3 = 0xfffffffffffffffd;
    }
LAB_00110dda:
    unaff_R13 = uVar3;
  } while (iVar2 == 3);
  if (iVar2 != 2) {
    return uVar3;
  }
  if (local_68 < 0) {
    return -2;
  }
  lVar5 = Cluster::HasBlockEntries(this,local_68,&local_38,&local_40);
  if (lVar5 < 0) {
    *pos = local_38;
    *len = local_40;
    return lVar5;
  }
  lVar9 = this->m_clusterCount;
  if (this->m_clusterPreloadCount < 1) goto LAB_00111027;
  uVar8 = 0xfffffffffffffffe;
  if (this->m_clusterSize <= lVar9) {
    return -2;
  }
  pCVar6 = this->m_clusters[lVar9];
  if ((pCVar6 == (Cluster *)0x0) || (-1 < pCVar6->m_index)) {
LAB_0011101d:
    uVar3 = uVar8;
    bVar1 = false;
  }
  else {
    lVar7 = Cluster::GetPosition(pCVar6);
    bVar1 = lVar7 != local_68;
    if (lVar7 == local_68) {
      if (lVar5 != 0) {
        if ((long)local_70 < 0) {
          if (pCVar6->m_element_size < 1) {
            uVar3 = 0xfffffffffffffffe;
            bVar1 = false;
            goto LAB_0011101f;
          }
          *pos = pCVar6->m_element_start + pCVar6->m_element_size;
        }
        else {
          *pos = *pos + local_70;
        }
        pCVar6->m_index = lVar9;
        this->m_clusterCount = this->m_clusterCount + 1;
        this->m_clusterPreloadCount = this->m_clusterPreloadCount + -1;
        lVar10 = *pos;
        this->m_pos = lVar10;
        uVar8 = (ulong)(lVar10 <= lVar11 || lVar11 < 0) * 2 - 2;
      }
      goto LAB_0011101d;
    }
  }
LAB_0011101f:
  if (!bVar1) {
    return uVar3;
  }
LAB_00111027:
  if (lVar5 == 0) {
    if (-1 < (long)local_70) {
      *pos = *pos + local_70;
    }
    lVar5 = *pos;
    if (lVar5 < local_58 || local_58 < 0) {
      if (lVar5 < lVar11 || lVar11 < 0) {
        this->m_pos = lVar5;
        return 2;
      }
      this->m_pos = lVar11;
    }
    else {
      this->m_pos = local_58;
    }
    lVar5 = 1;
  }
  else {
    pCVar6 = Cluster::Create(this,lVar9,local_68);
    lVar5 = -1;
    if (pCVar6 != (Cluster *)0x0) {
      if ((this->m_type == kTypeLiveStream) && (this->m_clusters != (Cluster **)0x0)) {
        this_00 = this->m_clusters[pCVar6->m_index + -1];
        if (this_00 != (Cluster *)0x0) {
          Cluster::~Cluster(this_00);
          operator_delete(this_00);
        }
        this->m_clusters[pCVar6->m_index + -1] = pCVar6;
      }
      else {
        bVar1 = AppendCluster(this,pCVar6);
        if (!bVar1) {
          Cluster::~Cluster(pCVar6);
          operator_delete(pCVar6);
          return -1;
        }
      }
      if ((long)local_70 < 0) {
        this->m_pUnknownSize = pCVar6;
        lVar5 = 0;
        this->m_pos = -*pos;
      }
      else {
        lVar5 = local_70 + *pos;
        *pos = lVar5;
        this->m_pos = lVar5;
        lVar5 = (ulong)(lVar5 <= lVar11 || lVar11 < 1) * 2 + -2;
      }
    }
  }
  return lVar5;
}

Assistant:

long Segment::DoLoadCluster(long long& pos, long& len) {
  if (m_pos < 0)
    return DoLoadClusterUnknownSize(pos, len);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  long long cluster_off = -1;  // offset relative to start of segment
  long long cluster_size = -1;  // size of cluster payload

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      return 1;  // no more clusters

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      return 1;  // no more clusters

    pos = m_pos;

    // Read ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume length of size of element

    // pos now points to start of payload

    if (size == 0) {
      // Missing element payload: move on.
      m_pos = pos;
      continue;
    }

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if ((segment_stop >= 0) && (size != unknown_size) &&
        ((pos + size) > segment_stop)) {
      return E_FILE_FORMAT_INVALID;
    }

    if (id == libwebm::kMkvCues) {
      if (size == unknown_size) {
        // Cues element of unknown size: Not supported.
        return E_FILE_FORMAT_INVALID;
      }

      if (m_pCues == NULL) {
        const long long element_size = (pos - idpos) + size;

        m_pCues = new (std::nothrow) Cues(this, pos, size, idpos, element_size);
        if (m_pCues == NULL)
          return -1;
      }

      m_pos = pos + size;  // consume payload
      continue;
    }

    if (id != libwebm::kMkvCluster) {
      // Besides the Segment, Libwebm allows only cluster elements of unknown
      // size. Fail the parse upon encountering a non-cluster element reporting
      // unknown size.
      if (size == unknown_size)
        return E_FILE_FORMAT_INVALID;

      m_pos = pos + size;  // consume payload
      continue;
    }

    // We have a cluster.

    cluster_off = idpos - m_start;  // relative pos

    if (size != unknown_size)
      cluster_size = size;

    break;
  }

  if (cluster_off < 0) {
    // No cluster, die.
    return E_FILE_FORMAT_INVALID;
  }

  long long pos_;
  long len_;

  status = Cluster::HasBlockEntries(this, cluster_off, pos_, len_);

  if (status < 0) {  // error, or underflow
    pos = pos_;
    len = len_;

    return status;
  }

  // status == 0 means "no block entries found"
  // status > 0 means "found at least one block entry"

  // TODO:
  // The issue here is that the segment increments its own
  // pos ptr past the most recent cluster parsed, and then
  // starts from there to parse the next cluster.  If we
  // don't know the size of the current cluster, then we
  // must either parse its payload (as we do below), looking
  // for the cluster (or cues) ID to terminate the parse.
  // This isn't really what we want: rather, we really need
  // a way to create the curr cluster object immediately.
  // The pity is that cluster::parse can determine its own
  // boundary, and we largely duplicate that same logic here.
  //
  // Maybe we need to get rid of our look-ahead preloading
  // in source::parse???
  //
  // As we're parsing the blocks in the curr cluster
  //(in cluster::parse), we should have some way to signal
  // to the segment that we have determined the boundary,
  // so it can adjust its own segment::m_pos member.
  //
  // The problem is that we're asserting in asyncreadinit,
  // because we adjust the pos down to the curr seek pos,
  // and the resulting adjusted len is > 2GB.  I'm suspicious
  // that this is even correct, but even if it is, we can't
  // be loading that much data in the cache anyway.

  const long idx = m_clusterCount;

  if (m_clusterPreloadCount > 0) {
    if (idx >= m_clusterSize)
      return E_FILE_FORMAT_INVALID;

    Cluster* const pCluster = m_clusters[idx];
    if (pCluster == NULL || pCluster->m_index >= 0)
      return E_FILE_FORMAT_INVALID;

    const long long off = pCluster->GetPosition();
    if (off < 0)
      return E_FILE_FORMAT_INVALID;

    if (off == cluster_off) {  // preloaded already
      if (status == 0)  // no entries found
        return E_FILE_FORMAT_INVALID;

      if (cluster_size >= 0)
        pos += cluster_size;
      else {
        const long long element_size = pCluster->GetElementSize();

        if (element_size <= 0)
          return E_FILE_FORMAT_INVALID;  // TODO: handle this case

        pos = pCluster->m_element_start + element_size;
      }

      pCluster->m_index = idx;  // move from preloaded to loaded
      ++m_clusterCount;
      --m_clusterPreloadCount;

      m_pos = pos;  // consume payload
      if (segment_stop >= 0 && m_pos > segment_stop)
        return E_FILE_FORMAT_INVALID;

      return 0;  // success
    }
  }

  if (status == 0) {  // no entries found
    if (cluster_size >= 0)
      pos += cluster_size;

    if ((total >= 0) && (pos >= total)) {
      m_pos = total;
      return 1;  // no more clusters
    }

    if ((segment_stop >= 0) && (pos >= segment_stop)) {
      m_pos = segment_stop;
      return 1;  // no more clusters
    }

    m_pos = pos;
    return 2;  // try again
  }

  // status > 0 means we have an entry

  Cluster* const pCluster = Cluster::Create(this, idx, cluster_off);
  if (pCluster == NULL)
    return -1;

  if (m_type != kTypeLiveStream || m_clusters == nullptr)
  {
    if (!AppendCluster(pCluster)) {
        delete pCluster;
        return -1;
    }
  } else { // m_type == kTypeLiveStream
      if (m_clusters[pCluster->m_index - 1] != nullptr) {
          delete m_clusters[pCluster->m_index - 1];
      }
      m_clusters[pCluster->m_index - 1] = pCluster;
  }

  if (cluster_size >= 0) {
    pos += cluster_size;

    m_pos = pos;

    if (segment_stop > 0 && m_pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    return 0;
  }

  m_pUnknownSize = pCluster;
  m_pos = -pos;

  return 0;  // partial success, since we have a new cluster

  // status == 0 means "no block entries found"
  // pos designates start of payload
  // m_pos has NOT been adjusted yet (in case we need to come back here)
}